

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

word * Gia_ObjSim(Gia_Man_t *p,int Id)

{
  uint uVar1;
  
  uVar1 = (p->vSimsPi->nSize / (p->vCis->nSize - p->nRegs)) * Id;
  if ((-1 < (int)uVar1) && ((int)uVar1 < p->vSims->nSize)) {
    return p->vSims->pArray + uVar1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

static inline word *       Gia_ObjSim( Gia_Man_t * p, int Id )                 { return Vec_WrdEntryP( p->vSims, Id * Gia_ObjSimWords(p) );     }